

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

JSValue js_os_setReadHandler(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  int64_t iVar1;
  JSValueUnion JVar2;
  list_head *plVar3;
  int iVar4;
  JSRuntime *pJVar5;
  JSOSRWHandler *pJVar6;
  ulong uVar7;
  JSOSRWHandler *pJVar8;
  ulong uVar9;
  JSValue *pJVar10;
  int64_t iVar11;
  JSValue v;
  JSValue JVar12;
  JSValue JVar13;
  int fd;
  int local_3c;
  JSValueUnion local_38;
  
  pJVar5 = JS_GetRuntime(ctx);
  pJVar6 = (JSOSRWHandler *)JS_GetRuntimeOpaque(pJVar5);
  iVar4 = JS_ToInt32(ctx,&local_3c,*argv);
  iVar11 = 6;
  if (iVar4 == 0) {
    iVar1 = argv[1].tag;
    pJVar8 = pJVar6;
    if ((uint)iVar1 == 2) {
      do {
        pJVar8 = (JSOSRWHandler *)(pJVar8->link).next;
        if (pJVar8 == pJVar6) {
          pJVar8 = (JSOSRWHandler *)0x0;
          break;
        }
      } while (pJVar8->fd != local_3c);
      iVar11 = 3;
      if (pJVar8 != (JSOSRWHandler *)0x0) {
        pJVar10 = pJVar8->rw_func + magic;
        JVar13 = *pJVar10;
        if ((0xfffffff4 < (uint)pJVar8->rw_func[magic].tag) &&
           (iVar4 = *(pJVar10->u).ptr, *(int *)(pJVar10->u).ptr = iVar4 + -1, iVar4 < 2)) {
          __JS_FreeValue(ctx,JVar13);
        }
        (pJVar10->u).int32 = 0;
        pJVar8->rw_func[magic].tag = 2;
        if (((int)pJVar8->rw_func[0].tag == 2) && ((int)pJVar8->rw_func[1].tag == 2)) {
          pJVar5 = JS_GetRuntime(ctx);
          free_rw_handler(pJVar5,pJVar8);
        }
      }
    }
    else {
      JVar2 = (JSValueUnion)argv[1].u.ptr;
      JVar13.tag = iVar1;
      JVar13.u.ptr = JVar2.ptr;
      iVar4 = JS_IsFunction(ctx,JVar13);
      if (iVar4 == 0) {
        JVar13 = JS_ThrowTypeError(ctx,"not a function");
        iVar11 = JVar13.tag;
        uVar9 = (ulong)JVar13.u.ptr & 0xffffffff00000000;
        uVar7 = (ulong)JVar13.u._0_4_;
        goto LAB_00113d9b;
      }
      do {
        pJVar8 = (JSOSRWHandler *)(pJVar8->link).next;
        if (pJVar8 == pJVar6) {
          pJVar8 = (JSOSRWHandler *)0x0;
          break;
        }
      } while (pJVar8->fd != local_3c);
      local_38 = JVar2;
      if (pJVar8 == (JSOSRWHandler *)0x0) {
        pJVar8 = (JSOSRWHandler *)js_mallocz(ctx,0x38);
        if (pJVar8 == (JSOSRWHandler *)0x0) goto LAB_00113d99;
        pJVar8->fd = local_3c;
        pJVar8->rw_func[0].u.int32 = 0;
        pJVar8->rw_func[0].tag = 2;
        pJVar8->rw_func[1].u.int32 = 0;
        pJVar8->rw_func[1].tag = 2;
        plVar3 = (pJVar6->link).prev;
        plVar3->next = (list_head *)pJVar8;
        (pJVar8->link).prev = plVar3;
        (pJVar8->link).next = (list_head *)pJVar6;
        (pJVar6->link).prev = (list_head *)pJVar8;
      }
      JVar2 = (JSValueUnion)pJVar8->rw_func[magic].u.ptr;
      iVar11 = pJVar8->rw_func[magic].tag;
      if ((0xfffffff4 < (uint)iVar11) &&
         (iVar4 = *JVar2.ptr, *(int *)JVar2.ptr = iVar4 + -1, iVar4 < 2)) {
        v.tag = iVar11;
        v.u.ptr = JVar2.ptr;
        __JS_FreeValue(ctx,v);
      }
      if (0xfffffff4 < (uint)iVar1) {
        *(int *)local_38.ptr = *local_38.ptr + 1;
      }
      pJVar8->rw_func[magic].u.ptr = (void *)local_38;
      pJVar8->rw_func[magic].tag = iVar1;
      iVar11 = 3;
    }
  }
LAB_00113d99:
  uVar7 = 0;
  uVar9 = 0;
LAB_00113d9b:
  JVar12.u.ptr = (void *)(uVar7 | uVar9);
  JVar12.tag = iVar11;
  return JVar12;
}

Assistant:

static JSValue js_os_setReadHandler(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv, int magic)
{
    JSRuntime *rt = JS_GetRuntime(ctx);
    JSThreadState *ts = JS_GetRuntimeOpaque(rt);
    JSOSRWHandler *rh;
    int fd;
    JSValueConst func;
    
    if (JS_ToInt32(ctx, &fd, argv[0]))
        return JS_EXCEPTION;
    func = argv[1];
    if (JS_IsNull(func)) {
        rh = find_rh(ts, fd);
        if (rh) {
            JS_FreeValue(ctx, rh->rw_func[magic]);
            rh->rw_func[magic] = JS_NULL;
            if (JS_IsNull(rh->rw_func[0]) &&
                JS_IsNull(rh->rw_func[1])) {
                /* remove the entry */
                free_rw_handler(JS_GetRuntime(ctx), rh);
            }
        }
    } else {
        if (!JS_IsFunction(ctx, func))
            return JS_ThrowTypeError(ctx, "not a function");
        rh = find_rh(ts, fd);
        if (!rh) {
            rh = js_mallocz(ctx, sizeof(*rh));
            if (!rh)
                return JS_EXCEPTION;
            rh->fd = fd;
            rh->rw_func[0] = JS_NULL;
            rh->rw_func[1] = JS_NULL;
            list_add_tail(&rh->link, &ts->os_rw_handlers);
        }
        JS_FreeValue(ctx, rh->rw_func[magic]);
        rh->rw_func[magic] = JS_DupValue(ctx, func);
    }
    return JS_UNDEFINED;
}